

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

void __thiscall polyscope::SurfaceMesh::computeDefaultFaceTangentBasisX(SurfaceMesh *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar4;
  uint uVar7;
  uint uVar8;
  pointer pvVar9;
  pointer pvVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  string local_50;
  
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->vertexPositions);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->faceNormals);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize((this->defaultFaceTangentBasisX).data,
           (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430 -
            *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428 >> 2) - 1)
  ;
  lVar15 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428;
  if (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430 - lVar15 != 4) {
    lVar17 = 2;
    uVar18 = 0;
    do {
      if (*(int *)(lVar15 + 4 + uVar18 * 4) - *(int *)(lVar15 + uVar18 * 4) != 3) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Default face tangent spaces only available for pure-triangular meshes","");
        exception(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      lVar15 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x440;
      uVar16 = (ulong)*(uint *)(*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).
                                          field_0x428 + uVar18 * 4);
      uVar18 = uVar18 + 1;
      uVar7 = *(uint *)(lVar15 + uVar16 * 4);
      uVar8 = *(uint *)(lVar15 + 4 + uVar16 * 4);
      pvVar9 = (((this->vertexPositions).data)->
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = pvVar9[uVar7].field_0;
      uVar5 = pvVar9[uVar7].field_1;
      auVar21._4_4_ = uVar5;
      auVar21._0_4_ = uVar2;
      auVar21._8_8_ = 0;
      uVar3 = pvVar9[uVar8].field_0;
      uVar6 = pvVar9[uVar8].field_1;
      auVar23._4_4_ = uVar6;
      auVar23._0_4_ = uVar3;
      auVar23._8_8_ = 0;
      fVar14 = pvVar9[uVar8].field_2.z - pvVar9[uVar7].field_2.z;
      pvVar9 = (((this->faceNormals).data)->
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar10 = (((this->defaultFaceTangentBasisX).data)->
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      auVar20 = vsubps_avx(auVar23,auVar21);
      uVar4 = *(undefined8 *)((long)pvVar9 + lVar17 * 4 + -8);
      fVar1 = (&pvVar9->field_0)[lVar17].x;
      fVar12 = (float)uVar4;
      auVar25._0_4_ = auVar20._0_4_ * fVar12;
      fVar13 = (float)((ulong)uVar4 >> 0x20);
      auVar25._4_4_ = auVar20._4_4_ * fVar13;
      auVar25._8_4_ = auVar20._8_4_ * 0.0;
      auVar25._12_4_ = auVar20._12_4_ * 0.0;
      auVar21 = vhaddps_avx(auVar25,auVar25);
      fVar11 = auVar21._0_4_ + fVar14 * fVar1;
      auVar24._0_4_ = fVar12 * fVar11;
      auVar24._4_4_ = fVar13 * fVar11;
      auVar24._8_4_ = fVar11 * 0.0;
      auVar24._12_4_ = fVar11 * 0.0;
      fVar14 = fVar14 - fVar1 * fVar11;
      auVar21 = vsubps_avx(auVar20,auVar24);
      fVar1 = auVar21._0_4_;
      auVar20._0_4_ = fVar1 * fVar1;
      fVar11 = auVar21._4_4_;
      auVar20._4_4_ = fVar11 * fVar11;
      fVar12 = auVar21._8_4_;
      auVar20._8_4_ = fVar12 * fVar12;
      fVar13 = auVar21._12_4_;
      auVar20._12_4_ = fVar13 * fVar13;
      auVar21 = vhaddps_avx(auVar20,auVar20);
      auVar21 = ZEXT416((uint)(fVar14 * fVar14 + auVar21._0_4_));
      auVar21 = vsqrtss_avx(auVar21,auVar21);
      fVar19 = 1.0 / auVar21._0_4_;
      auVar22._0_4_ = fVar1 * fVar19;
      auVar22._4_4_ = fVar11 * fVar19;
      auVar22._8_4_ = fVar12 * fVar19;
      auVar22._12_4_ = fVar13 * fVar19;
      uVar4 = vmovlps_avx(auVar22);
      *(undefined8 *)((long)pvVar10 + lVar17 * 4 + -8) = uVar4;
      (&pvVar10->field_0)[lVar17].x = fVar14 * fVar19;
      lVar17 = lVar17 + 3;
      lVar15 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428;
    } while (uVar18 < (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430
                       - lVar15 >> 2) - 1U);
  }
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::markHostBufferUpdated
            (&this->defaultFaceTangentBasisX);
  return;
}

Assistant:

void SurfaceMesh::computeDefaultFaceTangentBasisX() {

  // NOTE: this function is weirdly duplicated into an 'X' and 'Y' paradigm to fit the compute-function-per-buffer
  // paradigm

  vertexPositions.ensureHostBufferPopulated();
  faceNormals.ensureHostBufferPopulated();

  defaultFaceTangentBasisX.data.resize(nFaces());

  for (size_t iF = 0; iF < nFaces(); iF++) {
    size_t D = faceIndsStart[iF + 1] - faceIndsStart[iF];
    if (D != 3) exception("Default face tangent spaces only available for pure-triangular meshes");

    size_t start = faceIndsStart[iF];

    glm::vec3 pA = vertexPositions.data[faceIndsEntries[start + 0]];
    glm::vec3 pB = vertexPositions.data[faceIndsEntries[start + 1]];
    glm::vec3 N = faceNormals.data[iF];

    glm::vec3 basisX = pB - pA;
    basisX = glm::normalize(basisX - N * glm::dot(N, basisX));

    glm::vec3 basisY = glm::normalize(-glm::cross(basisX, N));

    defaultFaceTangentBasisX.data[iF] = basisX;
  }

  defaultFaceTangentBasisX.markHostBufferUpdated();
}